

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl.c
# Opt level: O0

yajl_status yajl_parse(yajl_handle hand,uchar *jsonText,size_t jsonTextLen)

{
  yajl_status yVar1;
  yajl_lexer pyVar2;
  long in_RDI;
  yajl_status status;
  size_t in_stack_00000058;
  uchar *in_stack_00000060;
  yajl_handle in_stack_00000068;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    pyVar2 = yajl_lex_alloc((yajl_alloc_funcs *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    *(yajl_lexer *)(in_RDI + 0x10) = pyVar2;
  }
  yVar1 = yajl_do_parse(in_stack_00000068,in_stack_00000060,in_stack_00000058);
  return yVar1;
}

Assistant:

yajl_status
yajl_parse(yajl_handle hand, const unsigned char * jsonText,
           size_t jsonTextLen)
{
    yajl_status status;

    /* lazy allocation of the lexer */
    if (hand->lexer == NULL) {
        hand->lexer = yajl_lex_alloc(&(hand->alloc),
                                     hand->flags & yajl_allow_comments,
                                     !(hand->flags & yajl_dont_validate_strings));
    }

    status = yajl_do_parse(hand, jsonText, jsonTextLen);
    return status;
}